

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O0

void __thiscall TokenScanner::TokenScanner(TokenScanner *this,istream *infile)

{
  istream *infile_local;
  TokenScanner *this_local;
  
  this->_vptr_TokenScanner = (_func_int **)&PTR__TokenScanner_00117a70;
  std::__cxx11::string::string((string *)&this->buffer);
  std::__cxx11::string::string((string *)&this->wordChars);
  initScanner(this);
  setInput(this,infile);
  return;
}

Assistant:

TokenScanner::TokenScanner(istream & infile) {
   initScanner();
   setInput(infile);
}